

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip,mz_uint flags)

{
  mz_bool mVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  ulong local_1338;
  ulong local_1330;
  ulong local_1328;
  mz_uint32 field_data_size;
  mz_uint32 field_id;
  mz_uint8 *pExtra_data;
  mz_uint32 extra_size_remaining;
  mz_uint64 local_header_ofs;
  mz_uint64 decomp_size;
  mz_uint64 comp_size;
  mz_uint ext_data_size;
  mz_uint filename_size;
  mz_uint bit_flags;
  mz_uint disk_index;
  mz_uint total_header_size;
  mz_uint n;
  mz_uint i;
  mz_uint64 zip64_size_of_central_directory;
  mz_uint64 zip64_size_of_end_of_central_dir_record;
  mz_uint64 zip64_cdir_total_entries_on_this_disk;
  mz_uint64 zip64_cdir_total_entries;
  mz_uint32 zip64_total_num_of_disks;
  mz_uint64 zip64_end_of_central_dir_ofs;
  mz_uint8 *pZip64_end_of_central_dir;
  mz_uint32 zip64_end_of_central_dir_header_u32 [14];
  mz_uint8 *pZip64_locator;
  mz_uint32 zip64_end_of_central_dir_locator_u32 [5];
  mz_bool sort_central_dir;
  mz_uint8 *pBuf;
  mz_uint32 buf_u32 [1024];
  mz_uint8 *p;
  mz_int64 cur_file_ofs;
  mz_uint64 cdir_ofs;
  uint local_218;
  mz_uint cdir_disk_index;
  mz_uint num_this_disk;
  mz_uint cdir_entries_on_this_disk;
  mz_uint cdir_size;
  mz_uint flags_local;
  mz_zip_archive *pZip_local;
  undefined4 local_6c;
  ulong local_68;
  mz_zip_array *local_60;
  mz_zip_archive *local_58;
  int local_50;
  undefined4 local_4c;
  ulong local_48;
  mz_zip_array *local_40;
  mz_zip_archive *local_38;
  int local_30;
  undefined4 local_2c;
  size_t local_28;
  mz_zip_internal_state *local_20;
  mz_zip_archive *local_18;
  int local_c;
  
  num_this_disk = 0;
  cdir_disk_index = 0;
  local_218 = 0;
  cdir_ofs._4_4_ = 0;
  cur_file_ofs = 0;
  p = (mz_uint8 *)0x0;
  unique0x00004880 = &pBuf;
  zip64_end_of_central_dir_locator_u32[3] = (mz_uint32)((flags & 0x800) == 0);
  zip64_end_of_central_dir_header_u32._48_8_ = &pZip64_locator;
  if (pZip->m_archive_size < 0x16) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_NOT_AN_ARCHIVE;
    }
    return 0;
  }
  cdir_entries_on_this_disk = flags;
  _cdir_size = pZip;
  mVar1 = mz_zip_reader_locate_header_sig(pZip,0x6054b50,0x16,(mz_int64 *)&p);
  if (mVar1 == 0) {
    if (_cdir_size != (mz_zip_archive *)0x0) {
      _cdir_size->m_last_error = MZ_ZIP_FAILED_FINDING_CENTRAL_DIR;
    }
    return 0;
  }
  sVar3 = (*_cdir_size->m_pRead)(_cdir_size->m_pIO_opaque,(mz_uint64)p,stack0xffffffffffffedc0,0x16)
  ;
  if (sVar3 != 0x16) {
    if (_cdir_size != (mz_zip_archive *)0x0) {
      _cdir_size->m_last_error = MZ_ZIP_FILE_READ_FAILED;
    }
    return 0;
  }
  if (*(int *)stack0xffffffffffffedc0 != 0x6054b50) {
    if (_cdir_size != (mz_zip_archive *)0x0) {
      _cdir_size->m_last_error = MZ_ZIP_NOT_AN_ARCHIVE;
    }
    return 0;
  }
  if (((0x4b < (long)p) &&
      (sVar3 = (*_cdir_size->m_pRead)
                         (_cdir_size->m_pIO_opaque,(mz_uint64)(p + -0x14),
                          (void *)zip64_end_of_central_dir_header_u32._48_8_,0x14), sVar3 == 0x14))
     && (*(int *)zip64_end_of_central_dir_header_u32._48_8_ == 0x7064b50)) {
    if (_cdir_size->m_archive_size - 0x38 <
        *(ulong *)(zip64_end_of_central_dir_header_u32._48_8_ + 8)) {
      if (_cdir_size != (mz_zip_archive *)0x0) {
        _cdir_size->m_last_error = MZ_ZIP_NOT_AN_ARCHIVE;
      }
      return 0;
    }
    sVar3 = (*_cdir_size->m_pRead)
                      (_cdir_size->m_pIO_opaque,
                       *(ulong *)(zip64_end_of_central_dir_header_u32._48_8_ + 8),
                       &pZip64_end_of_central_dir,0x38);
    if ((sVar3 == 0x38) && ((int)pZip64_end_of_central_dir == 0x6064b50)) {
      _cdir_size->m_pState->m_zip64 = 1;
    }
  }
  _cdir_size->m_total_files = (uint)*(ushort *)((long)stack0xffffffffffffedc0 + 10);
  cdir_disk_index = (mz_uint)*(ushort *)(stack0xffffffffffffedc0 + 1);
  local_218 = (uint)*(ushort *)((long)stack0xffffffffffffedc0 + 4);
  cdir_ofs._4_4_ = (uint)*(ushort *)((long)stack0xffffffffffffedc0 + 6);
  num_this_disk = *(mz_uint *)((long)stack0xffffffffffffedc0 + 0xc);
  cur_file_ofs = (mz_int64)*(uint *)(stack0xffffffffffffedc0 + 2);
  if (_cdir_size->m_pState->m_zip64 != 0) {
    if (stack0xffffffffffffed6c < 0x2c) {
      if (_cdir_size != (mz_zip_archive *)0x0) {
        _cdir_size->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
      }
      return 0;
    }
    if (*(int *)(zip64_end_of_central_dir_header_u32._48_8_ + 0x10) != 1) {
      if (_cdir_size != (mz_zip_archive *)0x0) {
        _cdir_size->m_last_error = MZ_ZIP_UNSUPPORTED_MULTIDISK;
      }
      return 0;
    }
    if (0xffffffff < (ulong)zip64_end_of_central_dir_header_u32._24_8_) {
      if (_cdir_size != (mz_zip_archive *)0x0) {
        _cdir_size->m_last_error = MZ_ZIP_TOO_MANY_FILES;
      }
      return 0;
    }
    _cdir_size->m_total_files = (mz_uint32)zip64_end_of_central_dir_header_u32._24_8_;
    if (0xffffffff < (ulong)zip64_end_of_central_dir_header_u32._16_8_) {
      if (_cdir_size != (mz_zip_archive *)0x0) {
        _cdir_size->m_last_error = MZ_ZIP_TOO_MANY_FILES;
      }
      return 0;
    }
    cdir_disk_index = (mz_uint)zip64_end_of_central_dir_header_u32._16_8_;
    if (0xffffffff < (ulong)zip64_end_of_central_dir_header_u32._32_8_) {
      if (_cdir_size != (mz_zip_archive *)0x0) {
        _cdir_size->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
      }
      return 0;
    }
    num_this_disk = (mz_uint)zip64_end_of_central_dir_header_u32._32_8_;
    local_218 = zip64_end_of_central_dir_header_u32[2];
    cdir_ofs._4_4_ = zip64_end_of_central_dir_header_u32[3];
    cur_file_ofs._0_4_ = zip64_end_of_central_dir_header_u32[10];
    cur_file_ofs._4_4_ = zip64_end_of_central_dir_header_u32[0xb];
  }
  if (_cdir_size->m_total_files != cdir_disk_index) {
    if (_cdir_size != (mz_zip_archive *)0x0) {
      _cdir_size->m_last_error = MZ_ZIP_UNSUPPORTED_MULTIDISK;
    }
    return 0;
  }
  if ((local_218 != 0 || cdir_ofs._4_4_ != 0) && ((local_218 != 1 || (cdir_ofs._4_4_ != 1)))) {
    if (_cdir_size != (mz_zip_archive *)0x0) {
      _cdir_size->m_last_error = MZ_ZIP_UNSUPPORTED_MULTIDISK;
    }
    return 0;
  }
  if (num_this_disk < _cdir_size->m_total_files * 0x2e) {
    if (_cdir_size != (mz_zip_archive *)0x0) {
      _cdir_size->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    }
    return 0;
  }
  if (_cdir_size->m_archive_size < cur_file_ofs + (ulong)num_this_disk) {
    if (_cdir_size != (mz_zip_archive *)0x0) {
      _cdir_size->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    }
    return 0;
  }
  _cdir_size->m_central_directory_file_ofs = cur_file_ofs;
  if (_cdir_size->m_total_files == 0) {
LAB_0010bacf:
    if (zip64_end_of_central_dir_locator_u32[3] != 0) {
      mz_zip_reader_sort_central_dir_offsets_by_filename(_cdir_size);
    }
    pZip_local._0_4_ = 1;
  }
  else {
    local_20 = _cdir_size->m_pState;
    local_28 = (size_t)num_this_disk;
    local_18 = _cdir_size;
    local_2c = 0;
    if (((local_20->m_central_dir).m_capacity < local_28) &&
       (mVar1 = mz_zip_array_ensure_capacity(_cdir_size,&local_20->m_central_dir,local_28,0),
       mVar1 == 0)) {
      local_c = 0;
    }
    else {
      (local_20->m_central_dir).m_size = local_28;
      local_c = 1;
    }
    if (local_c != 0) {
      local_40 = &_cdir_size->m_pState->m_central_dir_offsets;
      local_48 = (ulong)_cdir_size->m_total_files;
      local_38 = _cdir_size;
      local_4c = 0;
      if (((_cdir_size->m_pState->m_central_dir_offsets).m_capacity < local_48) &&
         (mVar1 = mz_zip_array_ensure_capacity(_cdir_size,local_40,local_48,0), mVar1 == 0)) {
        local_30 = 0;
      }
      else {
        local_40->m_size = local_48;
        local_30 = 1;
      }
      if (local_30 != 0) {
        if (zip64_end_of_central_dir_locator_u32[3] != 0) {
          local_60 = &_cdir_size->m_pState->m_sorted_central_dir_offsets;
          local_68 = (ulong)_cdir_size->m_total_files;
          local_58 = _cdir_size;
          local_6c = 0;
          if (((_cdir_size->m_pState->m_sorted_central_dir_offsets).m_capacity < local_68) &&
             (mVar1 = mz_zip_array_ensure_capacity(_cdir_size,local_60,local_68,0), mVar1 == 0)) {
            local_50 = 0;
          }
          else {
            local_60->m_size = local_68;
            local_50 = 1;
          }
          if (local_50 == 0) {
            if (_cdir_size != (mz_zip_archive *)0x0) {
              _cdir_size->m_last_error = MZ_ZIP_ALLOC_FAILED;
            }
            return 0;
          }
        }
        sVar3 = (*_cdir_size->m_pRead)
                          (_cdir_size->m_pIO_opaque,cur_file_ofs,
                           (_cdir_size->m_pState->m_central_dir).m_p,(size_t)num_this_disk);
        if (sVar3 != num_this_disk) {
          if (_cdir_size != (mz_zip_archive *)0x0) {
            _cdir_size->m_last_error = MZ_ZIP_FILE_READ_FAILED;
          }
          return 0;
        }
        buf_u32._4088_8_ = (_cdir_size->m_pState->m_central_dir).m_p;
        disk_index = num_this_disk;
        for (total_header_size = 0; total_header_size < _cdir_size->m_total_files;
            total_header_size = total_header_size + 1) {
          if ((disk_index < 0x2e) || (*(int *)buf_u32._4088_8_ != 0x2014b50)) {
            if (_cdir_size != (mz_zip_archive *)0x0) {
              _cdir_size->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
            }
            return 0;
          }
          *(mz_uint32 *)
           ((long)(_cdir_size->m_pState->m_central_dir_offsets).m_p + (ulong)total_header_size * 4)
               = (mz_uint32)buf_u32._4088_8_ - (int)(_cdir_size->m_pState->m_central_dir).m_p;
          if (zip64_end_of_central_dir_locator_u32[3] != 0) {
            *(mz_uint *)
             ((long)(_cdir_size->m_pState->m_sorted_central_dir_offsets).m_p +
             (ulong)total_header_size * 4) = total_header_size;
          }
          uVar4 = (ulong)*(uint *)(buf_u32._4088_8_ + 0x14);
          uVar5 = (ulong)*(uint *)(buf_u32._4088_8_ + 0x18);
          local_1338 = (ulong)*(uint *)(buf_u32._4088_8_ + 0x2a);
          pExtra_data._4_4_ = (uint)*(ushort *)(buf_u32._4088_8_ + 0x1e);
          if ((_cdir_size->m_pState->m_zip64_has_extended_info_fields == 0) &&
             (pExtra_data._4_4_ != 0)) {
            local_1328 = uVar5;
            if (uVar5 < uVar4) {
              local_1328 = uVar4;
            }
            if (local_1338 < local_1328) {
              local_1330 = uVar5;
              if (uVar5 < uVar4) {
                local_1330 = uVar4;
              }
              local_1338 = local_1330;
            }
            if ((local_1338 == 0xffffffff) && (pExtra_data._4_4_ != 0)) {
              _field_data_size =
                   (short *)(buf_u32._4088_8_ + 0x2e + (ulong)*(ushort *)(buf_u32._4088_8_ + 0x1c));
              do {
                if (pExtra_data._4_4_ < 4) {
                  if (_cdir_size != (mz_zip_archive *)0x0) {
                    _cdir_size->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
                  }
                  return 0;
                }
                uVar2 = (uint)(ushort)_field_data_size[1];
                if (pExtra_data._4_4_ < uVar2 + 4) {
                  if (_cdir_size != (mz_zip_archive *)0x0) {
                    _cdir_size->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
                  }
                  return 0;
                }
                if (*_field_data_size == 1) {
                  _cdir_size->m_pState->m_zip64 = 1;
                  _cdir_size->m_pState->m_zip64_has_extended_info_fields = 1;
                  break;
                }
                _field_data_size = (short *)((ulong)uVar2 + 4 + (long)_field_data_size);
                pExtra_data._4_4_ = (pExtra_data._4_4_ - 4) - uVar2;
              } while (pExtra_data._4_4_ != 0);
            }
          }
          if (((uVar4 != 0xffffffff) && (uVar5 != 0xffffffff)) &&
             (((*(int *)(buf_u32._4088_8_ + 10) == 0 && (uVar5 != uVar4)) ||
              ((uVar5 != 0 && (uVar4 == 0)))))) {
            if (_cdir_size != (mz_zip_archive *)0x0) {
              _cdir_size->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
            }
            return 0;
          }
          uVar2 = (uint)*(ushort *)(buf_u32._4088_8_ + 0x22);
          if ((uVar2 == 0xffff) || ((uVar2 != local_218 && (uVar2 != 1)))) {
            if (_cdir_size != (mz_zip_archive *)0x0) {
              _cdir_size->m_last_error = MZ_ZIP_UNSUPPORTED_MULTIDISK;
            }
            return 0;
          }
          if ((uVar4 != 0xffffffff) &&
             (_cdir_size->m_archive_size < (ulong)*(uint *)(buf_u32._4088_8_ + 0x2a) + 0x1e + uVar4)
             ) {
            if (_cdir_size != (mz_zip_archive *)0x0) {
              _cdir_size->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
            }
            return 0;
          }
          if ((*(ushort *)(buf_u32._4088_8_ + 8) & 0x2000) != 0) {
            if (_cdir_size != (mz_zip_archive *)0x0) {
              _cdir_size->m_last_error = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
            }
            return 0;
          }
          uVar2 = *(ushort *)(buf_u32._4088_8_ + 0x1c) + 0x2e +
                  (uint)*(ushort *)(buf_u32._4088_8_ + 0x1e) +
                  (uint)*(ushort *)(buf_u32._4088_8_ + 0x20);
          if (disk_index < uVar2) {
            if (_cdir_size != (mz_zip_archive *)0x0) {
              _cdir_size->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
            }
            return 0;
          }
          disk_index = disk_index - uVar2;
          buf_u32._4088_8_ = buf_u32._4088_8_ + (ulong)uVar2;
        }
        goto LAB_0010bacf;
      }
    }
    if (_cdir_size != (mz_zip_archive *)0x0) {
      _cdir_size->m_last_error = MZ_ZIP_ALLOC_FAILED;
    }
    pZip_local._0_4_ = 0;
  }
  return (mz_bool)pZip_local;
}

Assistant:

static mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip, mz_uint flags)
{
    mz_uint cdir_size = 0, cdir_entries_on_this_disk = 0, num_this_disk = 0, cdir_disk_index = 0;
    mz_uint64 cdir_ofs = 0;
    mz_int64 cur_file_ofs = 0;
    const mz_uint8 *p;

    mz_uint32 buf_u32[4096 / sizeof(mz_uint32)];
    mz_uint8 *pBuf = (mz_uint8 *)buf_u32;
    mz_bool sort_central_dir = ((flags & MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY) == 0);
    mz_uint32 zip64_end_of_central_dir_locator_u32[(MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pZip64_locator = (mz_uint8 *)zip64_end_of_central_dir_locator_u32;

    mz_uint32 zip64_end_of_central_dir_header_u32[(MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pZip64_end_of_central_dir = (mz_uint8 *)zip64_end_of_central_dir_header_u32;

    mz_uint64 zip64_end_of_central_dir_ofs = 0;

    /* Basic sanity checks - reject files which are too small, and check the first 4 bytes of the file to make sure a local header is there. */
    if (pZip->m_archive_size < MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

    if (!mz_zip_reader_locate_header_sig(pZip, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE, &cur_file_ofs))
        return mz_zip_set_error(pZip, MZ_ZIP_FAILED_FINDING_CENTRAL_DIR);

    /* Read and verify the end of central directory record. */
    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) != MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_SIG_OFS) != MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

    if (cur_file_ofs >= (MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE + MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE))
    {
        if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs - MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE, pZip64_locator, MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE) == MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE)
        {
            if (MZ_READ_LE32(pZip64_locator + MZ_ZIP64_ECDL_SIG_OFS) == MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIG)
            {
                zip64_end_of_central_dir_ofs = MZ_READ_LE64(pZip64_locator + MZ_ZIP64_ECDL_REL_OFS_TO_ZIP64_ECDR_OFS);
                if (zip64_end_of_central_dir_ofs > (pZip->m_archive_size - MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE))
                    return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

                if (pZip->m_pRead(pZip->m_pIO_opaque, zip64_end_of_central_dir_ofs, pZip64_end_of_central_dir, MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE) == MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE)
                {
                    if (MZ_READ_LE32(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_SIG_OFS) == MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIG)
                    {
                        pZip->m_pState->m_zip64 = MZ_TRUE;
                    }
                }
            }
        }
    }

    pZip->m_total_files = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_TOTAL_ENTRIES_OFS);
    cdir_entries_on_this_disk = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS);
    num_this_disk = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_THIS_DISK_OFS);
    cdir_disk_index = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_DISK_CDIR_OFS);
    cdir_size = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_SIZE_OFS);
    cdir_ofs = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_OFS_OFS);

    if (pZip->m_pState->m_zip64)
    {
        mz_uint32 zip64_total_num_of_disks = MZ_READ_LE32(pZip64_locator + MZ_ZIP64_ECDL_TOTAL_NUMBER_OF_DISKS_OFS);
        mz_uint64 zip64_cdir_total_entries = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_TOTAL_ENTRIES_OFS);
        mz_uint64 zip64_cdir_total_entries_on_this_disk = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS);
        mz_uint64 zip64_size_of_end_of_central_dir_record = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_SIZE_OF_RECORD_OFS);
        mz_uint64 zip64_size_of_central_directory = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_SIZE_OFS);

        if (zip64_size_of_end_of_central_dir_record < (MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE - 12))
            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

        if (zip64_total_num_of_disks != 1U)
            return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

        /* Check for miniz's practical limits */
        if (zip64_cdir_total_entries > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);

        pZip->m_total_files = (mz_uint32)zip64_cdir_total_entries;

        if (zip64_cdir_total_entries_on_this_disk > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);

        cdir_entries_on_this_disk = (mz_uint32)zip64_cdir_total_entries_on_this_disk;

        /* Check for miniz's current practical limits (sorry, this should be enough for millions of files) */
        if (zip64_size_of_central_directory > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

        cdir_size = (mz_uint32)zip64_size_of_central_directory;

        num_this_disk = MZ_READ_LE32(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_NUM_THIS_DISK_OFS);

        cdir_disk_index = MZ_READ_LE32(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_NUM_DISK_CDIR_OFS);

        cdir_ofs = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_OFS_OFS);
    }

    if (pZip->m_total_files != cdir_entries_on_this_disk)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

    if (((num_this_disk | cdir_disk_index) != 0) && ((num_this_disk != 1) || (cdir_disk_index != 1)))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

    if (cdir_size < pZip->m_total_files * MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    if ((cdir_ofs + (mz_uint64)cdir_size) > pZip->m_archive_size)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    pZip->m_central_directory_file_ofs = cdir_ofs;

    if (pZip->m_total_files)
    {
        mz_uint i, n;
        /* Read the entire central directory into a heap block, and allocate another heap block to hold the unsorted central dir file record offsets, and possibly another to hold the sorted indices. */
        if ((!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir, cdir_size, MZ_FALSE)) ||
            (!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir_offsets, pZip->m_total_files, MZ_FALSE)))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

        if (sort_central_dir)
        {
            if (!mz_zip_array_resize(pZip, &pZip->m_pState->m_sorted_central_dir_offsets, pZip->m_total_files, MZ_FALSE))
                return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (pZip->m_pRead(pZip->m_pIO_opaque, cdir_ofs, pZip->m_pState->m_central_dir.m_p, cdir_size) != cdir_size)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

        /* Now create an index into the central directory file records, do some basic sanity checking on each record */
        p = (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p;
        for (n = cdir_size, i = 0; i < pZip->m_total_files; ++i)
        {
            mz_uint total_header_size, disk_index, bit_flags, filename_size, ext_data_size;
            mz_uint64 comp_size, decomp_size, local_header_ofs;

            if ((n < MZ_ZIP_CENTRAL_DIR_HEADER_SIZE) || (MZ_READ_LE32(p) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG))
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32, i) = (mz_uint32)(p - (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p);

            if (sort_central_dir)
                MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_sorted_central_dir_offsets, mz_uint32, i) = i;

            comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
            decomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
            local_header_ofs = MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS);
            filename_size = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);
            ext_data_size = MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS);

            if ((!pZip->m_pState->m_zip64_has_extended_info_fields) &&
                (ext_data_size) &&
                (MZ_MAX(MZ_MAX(comp_size, decomp_size), local_header_ofs) == MZ_UINT32_MAX))
            {
                /* Attempt to find zip64 extended information field in the entry's extra data */
                mz_uint32 extra_size_remaining = ext_data_size;

                if (extra_size_remaining)
                {
                    const mz_uint8 *pExtra_data = p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size;

                    do
                    {
                        mz_uint32 field_id;
                        mz_uint32 field_data_size;

                        if (extra_size_remaining < (sizeof(mz_uint16) * 2))
                            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                        field_id = MZ_READ_LE16(pExtra_data);
                        field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));

                        if ((field_data_size + sizeof(mz_uint16) * 2) > extra_size_remaining)
                            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                        if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
                        {
                            /* Ok, the archive didn't have any zip64 headers but it uses a zip64 extended information field so mark it as zip64 anyway (this can occur with infozip's zip util when it reads compresses files from stdin). */
                            pZip->m_pState->m_zip64 = MZ_TRUE;
                            pZip->m_pState->m_zip64_has_extended_info_fields = MZ_TRUE;
                            break;
                        }

                        pExtra_data += sizeof(mz_uint16) * 2 + field_data_size;
                        extra_size_remaining = extra_size_remaining - sizeof(mz_uint16) * 2 - field_data_size;
                    } while (extra_size_remaining);
                }
            }

            /* I've seen archives that aren't marked as zip64 that uses zip64 ext data, argh */
            if ((comp_size != MZ_UINT32_MAX) && (decomp_size != MZ_UINT32_MAX))
            {
                if (((!MZ_READ_LE32(p + MZ_ZIP_CDH_METHOD_OFS)) && (decomp_size != comp_size)) || (decomp_size && !comp_size))
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            disk_index = MZ_READ_LE16(p + MZ_ZIP_CDH_DISK_START_OFS);
            if ((disk_index == MZ_UINT16_MAX) || ((disk_index != num_this_disk) && (disk_index != 1)))
                return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

            if (comp_size != MZ_UINT32_MAX)
            {
                if (((mz_uint64)MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS) + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + comp_size) > pZip->m_archive_size)
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            bit_flags = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
            if (bit_flags & MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_LOCAL_DIR_IS_MASKED)
                return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);

            if ((total_header_size = MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS) + MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS) + MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS)) > n)
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            n -= total_header_size;
            p += total_header_size;
        }
    }

    if (sort_central_dir)
        mz_zip_reader_sort_central_dir_offsets_by_filename(pZip);

    return MZ_TRUE;
}